

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::dtime_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>
          (Interpolator<false> *this,dtime_t *v_t,Vector *result,
          MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t> *accessor)

{
  idx_t iVar1;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>_>
  __comp_01;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  idx_t iVar5;
  OutOfRangeException *pOVar6;
  InvalidInputException *pIVar7;
  int64_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  long lVar11;
  interval_t iVar12;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_78;
  interval_t local_58;
  interval_t local_48;
  
  bVar2 = this->desc;
  iVar9 = this->CRN;
  iVar10 = this->FRN;
  iVar1 = this->begin;
  iVar5 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar2;
  if (iVar9 == iVar10) {
    if (iVar9 != iVar5 && iVar1 != iVar5) {
      uVar3 = (long)(iVar5 * 8 + iVar1 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar2;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar5,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar9 = this->FRN;
    }
    lVar4 = v_t[iVar9].micros - accessor->median->micros;
    if (lVar4 == -0x8000000000000000) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar6,&local_78,-0x8000000000000000);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar11 = -lVar4;
    if (0 < lVar4) {
      lVar11 = lVar4;
    }
    iVar12 = (interval_t)duckdb::Interval::FromMicro(lVar11);
    input._0_8_ = iVar12.micros;
    iVar8 = 0;
    bVar2 = duckdb::TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (iVar12,&local_58,false);
    if (!bVar2) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,iVar12._0_8_,input);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar12.days = local_58.days;
    iVar12.months = local_58.months;
    iVar12.micros._0_4_ = (undefined4)local_58.micros;
    iVar12.micros._4_4_ = local_58.micros._4_4_;
  }
  else {
    if (iVar10 != iVar5 && iVar1 != iVar5) {
      uVar3 = (long)(iVar5 * 8 + iVar1 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar2;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>>>
                (v_t + iVar1,v_t + iVar10,v_t + iVar5,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar10 = this->FRN;
      iVar9 = this->CRN;
      iVar5 = this->end;
    }
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar2;
    if (iVar9 != iVar5 && iVar10 != iVar5) {
      uVar3 = (long)(iVar5 * 8 + iVar10 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar2;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>>>
                (v_t + iVar10,v_t + iVar9,v_t + iVar5,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar10 = this->FRN;
    }
    lVar4 = v_t[iVar10].micros - accessor->median->micros;
    if (lVar4 == -0x8000000000000000) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar6,&local_78,-0x8000000000000000);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar11 = -lVar4;
    if (0 < lVar4) {
      lVar11 = lVar4;
    }
    iVar12 = (interval_t)duckdb::Interval::FromMicro(lVar11);
    input_00._0_8_ = iVar12.micros;
    iVar8 = 0;
    bVar2 = duckdb::TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (iVar12,&local_58,false);
    if (!bVar2) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,iVar12._0_8_,input_00);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48.months = local_58.months;
    local_48.days = local_58.days;
    local_48.micros._0_4_ = (undefined4)local_58.micros;
    local_48.micros._4_4_ = local_58.micros._4_4_;
    lVar4 = v_t[this->CRN].micros - accessor->median->micros;
    if (lVar4 == -0x8000000000000000) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar6,&local_78,-0x8000000000000000);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar11 = -lVar4;
    if (0 < lVar4) {
      lVar11 = lVar4;
    }
    iVar12 = (interval_t)duckdb::Interval::FromMicro(lVar11);
    input_01._0_8_ = iVar12.micros;
    iVar8 = 0;
    bVar2 = duckdb::TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (iVar12,&local_58,false);
    if (!bVar2) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,iVar12._0_8_,input_01);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar12 = CastInterpolation::Interpolate<duckdb::interval_t>
                       (&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_78);
  }
  return iVar12;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}